

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_test.cc
# Opt level: O2

void re2::RegexpBigConcat(void)

{
  __type _Var1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  Regexp *this;
  size_t i;
  ulong uVar5;
  Regexp *x;
  vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  LogMessageFatal local_1a0;
  
  local_1a0.super_LogMessage._0_8_ = "x";
  local_1a0.super_LogMessage._8_4_ = 1;
  x = Regexp::Parse((StringPiece *)&local_1a0,NoParseFlags,(RegexpStatus *)0x0);
  std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::vector
            (&v,90000,&x,(allocator_type *)&local_1a0);
  for (uVar5 = 0;
      uVar5 < (ulong)((long)v.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)v.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1) {
    Regexp::Incref(x);
  }
  iVar2 = Regexp::Ref(x);
  iVar3 = (int)((ulong)((long)v.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)v.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  if (iVar2 != iVar3 + 1) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x22);
    poVar4 = std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,
                             "Check failed: (x->Ref()) == (1 + static_cast<int>(v.size()))");
    iVar3 = Regexp::Ref(x);
    std::ostream::operator<<(poVar4,iVar3);
    LogMessageFatal::~LogMessageFatal(&local_1a0);
    iVar3 = (int)((ulong)((long)v.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)v.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  this = Regexp::Concat(v.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>._M_impl.
                        super__Vector_impl_data._M_start,iVar3,NoParseFlags);
  Regexp::ToString_abi_cxx11_((string *)&local_1a0,this);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_1c0,
             (char)((long)v.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)v.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3));
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_1a0,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (!_Var1) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x25);
    std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,
                    "Check failed: (re->ToString()) == (string(v.size(), \'x\'))");
    LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  Regexp::Decref(this);
  iVar3 = Regexp::Ref(x);
  if (iVar3 != 1) {
    LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_test.cc"
               ,0x27);
    poVar4 = std::operator<<((ostream *)&local_1a0.super_LogMessage.str_,
                             "Check failed: (x->Ref()) == (1)");
    iVar3 = Regexp::Ref(x);
    std::ostream::operator<<(poVar4,iVar3);
    LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  Regexp::Decref(x);
  std::_Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::~_Vector_base
            (&v.super__Vector_base<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>);
  return;
}

Assistant:

TEST(Regexp, NamedCaptures) {
  Regexp* x;
  RegexpStatus status;
  x = Regexp::Parse(
      "(?P<g1>a+)|(e)(?P<g2>w*)+(?P<g1>b+)", Regexp::PerlX, &status);
  EXPECT_TRUE(status.ok());
  EXPECT_EQ(4, x->NumCaptures());
  const map<string, int>* have = x->NamedCaptures();
  EXPECT_TRUE(have != NULL);
  EXPECT_EQ(2, have->size());  // there are only two named groups in
                               // the regexp: 'g1' and 'g2'.
  map<string, int> want;
  want["g1"] = 1;
  want["g2"] = 3;
  EXPECT_EQ(want, *have);
  x->Decref();
  delete have;
}